

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

void __thiscall BigInt::BigInt(BigInt *this,string *value_and_sign)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  string local_b8 [32];
  string local_98 [36];
  int local_74;
  string local_70 [4];
  int i;
  string local_50 [55];
  byte local_19;
  string *psStack_18;
  bool positive;
  string *value_and_sign_local;
  BigInt *this_local;
  
  psStack_18 = value_and_sign;
  value_and_sign_local = (string *)this;
  std::vector<int,_std::allocator<int>_>::vector(&this->value);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)value_and_sign);
  if (*pcVar2 == '-') {
    local_19 = 0;
    std::__cxx11::string::substr((ulong)local_50,(ulong)value_and_sign);
    std::__cxx11::string::operator=((string *)value_and_sign,local_50);
    std::__cxx11::string::~string(local_50);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)value_and_sign);
    if (*pcVar2 == '+') {
      local_19 = 1;
      std::__cxx11::string::substr((ulong)local_70,(ulong)value_and_sign);
      std::__cxx11::string::operator=((string *)value_and_sign,local_70);
      std::__cxx11::string::~string(local_70);
    }
    else {
      local_19 = 1;
    }
  }
  local_74 = 0;
  while ((uVar3 = (ulong)local_74, lVar4 = std::__cxx11::string::size(), uVar3 < lVar4 - 1U &&
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)value_and_sign), *pcVar2 == '0'))
        ) {
    local_74 = local_74 + 1;
  }
  std::__cxx11::string::substr((ulong)local_98,(ulong)value_and_sign);
  std::__cxx11::string::operator=((string *)value_and_sign,local_98);
  std::__cxx11::string::~string(local_98);
  bVar1 = std::operator==(value_and_sign,"0");
  if (bVar1) {
    local_19 = 1;
  }
  std::__cxx11::string::string(local_b8,(string *)value_and_sign);
  set_number(this,(string *)local_b8,(bool)(local_19 & 1));
  std::__cxx11::string::~string(local_b8);
  return;
}

Assistant:

BigInt::BigInt(string value_and_sign) {
    bool positive;
    if (value_and_sign[0] == '-') {
        positive = false;
        value_and_sign = value_and_sign.substr(1);
    } else if (value_and_sign[0] == '+') {
        positive = true;
        value_and_sign = value_and_sign.substr(1);
    } else {
        positive = true;
    }
    int i = 0;
    while (i < value_and_sign.size() - 1) {
        if (value_and_sign[i] != '0') {
            break;
        }
        ++i;
    }
    value_and_sign = value_and_sign.substr(i);
    if (value_and_sign == "0") {
        positive = true;
    }
    //    printf("structor %s \n", value_and_sign.c_str());
    this->set_number(value_and_sign, positive);
}